

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::~ClipperOffset(ClipperOffset *this)

{
  Clear(this);
  PolyNode::~PolyNode(&this->m_polyNodes);
  std::_Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
  ~_Vector_base(&(this->m_normals).
                 super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
               );
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&(this->m_destPoly).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&(this->m_srcPoly).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&this->m_destPolys);
  return;
}

Assistant:

ClipperOffset::~ClipperOffset()
{
  Clear();
}